

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStreamComponent_RegisterChannels
                  (PaAlsaStreamComponent *self,PaUtilBufferProcessor *bp,unsigned_long *numFrames,
                  int *xrun)

{
  uint uVar1;
  PaUtilConverter *pPVar2;
  undefined8 uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  code *pcVar8;
  pthread_t __thread1;
  void *pvVar9;
  ssize_t sVar10;
  uchar *puVar11;
  snd_pcm_sframes_t sVar12;
  long in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  PaHostApiTypeId hostApiType;
  int *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  PaAlsaStreamComponent *pPStack_a0;
  int i_1;
  uchar *buffer_1;
  uint buf_per_ch_size_1;
  unsigned_long __vla_expr0;
  int local_7c;
  int res;
  uint buf_per_ch_size;
  int swidth;
  uint bufferSize;
  int __pa_unsure_error_id;
  unsigned_long framesAvail;
  uchar *puStack_58;
  int i;
  uchar *p;
  uchar *buffer;
  _func_void_PaUtilBufferProcessor_ptr_uint_void_ptr_uint *setChannel;
  snd_pcm_channel_area_t *area;
  snd_pcm_channel_area_t *areas;
  int *piStack_28;
  PaError result;
  int *xrun_local;
  unsigned_long *numFrames_local;
  PaUtilBufferProcessor *bp_local;
  PaAlsaStreamComponent *self_local;
  
  hostApiType = (PaHostApiTypeId)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  areas._4_4_ = 0;
  pcVar8 = PaUtil_SetOutputChannel;
  if (self->streamDir == StreamDirection_In) {
    pcVar8 = PaUtil_SetInputChannel;
  }
  piStack_28 = xrun;
  xrun_local = (int *)numFrames;
  numFrames_local = &bp->framesPerUserBuffer;
  bp_local = (PaUtilBufferProcessor *)self;
  paUtilErr_ = PaAlsaStreamComponent_GetAvailableFrames
                         (pPStack_a0,
                          (unsigned_long *)
                          CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                          in_stack_ffffffffffffff50);
  if (paUtilErr_ < 0) {
    PaUtil_DebugPrint(
                     "Expression \'PaAlsaStreamComponent_GetAvailableFrames( self, &framesAvail, xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3969\n"
                     );
    areas._4_4_ = paUtilErr_;
  }
  else if (*piStack_28 == 0) {
    if (bp_local->userOutputSampleFormatIsEqualToHost == 0) {
      iVar5 = *(int *)((long)&bp_local->framesPerHostBuffer + 4);
      sVar10 = (*alsa_snd_pcm_format_size)(bp_local->bytesPerUserOutputSample,*(size_t *)xrun_local)
      ;
      uVar7 = iVar5 * (int)sVar10;
      if (bp_local->inputChannelCount < uVar7) {
        bp_local->inputChannelCount = uVar7;
        pvVar9 = realloc((void *)bp_local->framesPerTempBuffer,(ulong)uVar7);
        bp_local->framesPerTempBuffer = (unsigned_long)pvVar9;
        if (bp_local->framesPerTempBuffer == 0) {
          return -0x2708;
        }
      }
    }
    else {
      iVar5 = (*alsa_snd_pcm_mmap_begin)
                        ((snd_pcm_t *)bp_local->inputConverter,&area,
                         &bp_local->initialFramesInTempInputBuffer,(snd_pcm_uframes_t *)xrun_local);
      if (iVar5 < 0) {
        __thread1 = pthread_self();
        iVar6 = pthread_equal(__thread1,paUnixMainThread);
        if (iVar6 != 0) {
          (*alsa_snd_strerror)(iVar5);
          PaUtil_SetLastHostErrorInfo(hostApiType,in_stack_ffffffffffffff38,(char *)0x11e892);
        }
        PaUtil_DebugPrint(
                         "Expression \'alsa_snd_pcm_mmap_begin( self->pcm, &areas, &self->offset, numFrames )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3978\n"
                         );
        return -9999;
      }
      bp_local->tempInputBuffer = area;
    }
    if (bp_local->useNonAdaptingProcess == 0) {
      if (bp_local->userOutputSampleFormatIsEqualToHost == 0) {
        uVar7 = bp_local->inputChannelCount;
        uVar1 = *(uint *)((long)&bp_local->framesPerHostBuffer + 4);
        p = (uchar *)bp_local->framesPerTempBuffer;
        for (framesAvail._4_4_ = 0; framesAvail._4_4_ < (int)bp_local->framesPerHostBuffer;
            framesAvail._4_4_ = framesAvail._4_4_ + 1) {
          (*pcVar8)(numFrames_local,framesAvail._4_4_,p,1);
          p = p + uVar7 / uVar1;
        }
      }
      else {
        for (framesAvail._4_4_ = 0; framesAvail._4_4_ < (int)bp_local->framesPerHostBuffer;
            framesAvail._4_4_ = framesAvail._4_4_ + 1) {
          puVar11 = ExtractAddress(area + framesAvail._4_4_,bp_local->initialFramesInTempInputBuffer
                                  );
          (*pcVar8)(numFrames_local,framesAvail._4_4_,puVar11,1);
        }
      }
    }
    else {
      sVar10 = (*alsa_snd_pcm_format_size)(bp_local->bytesPerUserOutputSample,1);
      if (bp_local->userOutputSampleFormatIsEqualToHost == 0) {
        puStack_58 = (uchar *)bp_local->framesPerTempBuffer;
      }
      else {
        puStack_58 = ExtractAddress(area,bp_local->initialFramesInTempInputBuffer);
      }
      for (framesAvail._4_4_ = 0; framesAvail._4_4_ < (int)bp_local->framesPerHostBuffer;
          framesAvail._4_4_ = framesAvail._4_4_ + 1) {
        (*pcVar8)(numFrames_local,framesAvail._4_4_,puStack_58,
                  *(undefined4 *)((long)&bp_local->framesPerHostBuffer + 4));
        puStack_58 = puStack_58 + (int)sVar10;
      }
    }
    if ((bp_local->userOutputSampleFormatIsEqualToHost == 0) &&
       ((int)bp_local->initialFramesInTempOutputBuffer == 0)) {
      if (bp_local->useNonAdaptingProcess == 0) {
        lVar4 = -((ulong)*(uint *)((long)&bp_local->framesPerHostBuffer + 4) * 8 + 0xf &
                 0xfffffffffffffff0);
        uVar7 = bp_local->inputChannelCount;
        uVar1 = *(uint *)((long)&bp_local->framesPerHostBuffer + 4);
        pPStack_a0 = (PaAlsaStreamComponent *)bp_local->framesPerTempBuffer;
        for (iVar5 = 0; iVar5 < *(int *)((long)&bp_local->framesPerHostBuffer + 4);
            iVar5 = iVar5 + 1) {
          *(PaAlsaStreamComponent **)(&stack0xffffffffffffff38 + lVar4 + (long)iVar5 * 8) =
               pPStack_a0;
          pPStack_a0 = (PaAlsaStreamComponent *)((long)pPStack_a0 + (ulong)(uVar7 / uVar1));
        }
        pPVar2 = bp_local->inputConverter;
        uVar3 = *(undefined8 *)xrun_local;
        *(undefined8 *)(&stack0xffffffffffffff30 + lVar4) = 0x11ebe6;
        local_7c = (*(code *)alsa_snd_pcm_readn)(pPVar2,&stack0xffffffffffffff38 + lVar4,uVar3);
      }
      else {
        sVar12 = (*alsa_snd_pcm_readi)
                           ((snd_pcm_t *)bp_local->inputConverter,
                            (void *)bp_local->framesPerTempBuffer,*(snd_pcm_uframes_t *)xrun_local);
        local_7c = (int)sVar12;
      }
      if ((local_7c == -0x20) || (local_7c == -0x56)) {
        *piStack_28 = 1;
        xrun_local[0] = 0;
        xrun_local[1] = 0;
      }
    }
  }
  else {
    xrun_local[0] = 0;
    xrun_local[1] = 0;
  }
  return areas._4_4_;
}

Assistant:

static PaError PaAlsaStreamComponent_RegisterChannels( PaAlsaStreamComponent* self, PaUtilBufferProcessor* bp,
        unsigned long* numFrames, int* xrun )
{
    PaError result = paNoError;
    const snd_pcm_channel_area_t *areas, *area;
    void (*setChannel)(PaUtilBufferProcessor *, unsigned int, void *, unsigned int) =
        StreamDirection_In == self->streamDir ? PaUtil_SetInputChannel : PaUtil_SetOutputChannel;
    unsigned char *buffer, *p;
    int i;
    unsigned long framesAvail;

    /* This _must_ be called before mmap_begin */
    PA_ENSURE( PaAlsaStreamComponent_GetAvailableFrames( self, &framesAvail, xrun ) );
    if( *xrun )
    {
        *numFrames = 0;
        goto end;
    }

    if( self->canMmap )
    {
        ENSURE_( alsa_snd_pcm_mmap_begin( self->pcm, &areas, &self->offset, numFrames ), paUnanticipatedHostError );
        /* @concern ChannelAdaption Buffer address is recorded so we can do some channel adaption later */
        self->channelAreas = (snd_pcm_channel_area_t *)areas;
    }
    else
    {
        unsigned int bufferSize = self->numHostChannels * alsa_snd_pcm_format_size( self->nativeFormat, *numFrames );
        if( bufferSize > self->nonMmapBufferSize )
        {
            self->nonMmapBuffer = realloc( self->nonMmapBuffer, ( self->nonMmapBufferSize = bufferSize ) );
            if( !self->nonMmapBuffer )
            {
                result = paInsufficientMemory;
                goto error;
            }
        }
    }

    if( self->hostInterleaved )
    {
        int swidth = alsa_snd_pcm_format_size( self->nativeFormat, 1 );

        p = buffer = self->canMmap ? ExtractAddress( areas, self->offset ) : self->nonMmapBuffer;
        for( i = 0; i < self->numUserChannels; ++i )
        {
            /* We're setting the channels up to userChannels, but the stride will be hostChannels samples */
            setChannel( bp, i, p, self->numHostChannels );
            p += swidth;
        }
    }
    else
    {
        if( self->canMmap )
        {
            for( i = 0; i < self->numUserChannels; ++i )
            {
                area = areas + i;
                buffer = ExtractAddress( area, self->offset );
                setChannel( bp, i, buffer, 1 );
            }
        }
        else
        {
            unsigned int buf_per_ch_size = self->nonMmapBufferSize / self->numHostChannels;
            buffer = self->nonMmapBuffer;
            for( i = 0; i < self->numUserChannels; ++i )
            {
                setChannel( bp, i, buffer, 1 );
                buffer += buf_per_ch_size;
            }
        }
    }

    if( !self->canMmap && StreamDirection_In == self->streamDir )
    {
        /* Read sound */
        int res;
        if( self->hostInterleaved )
            res = alsa_snd_pcm_readi( self->pcm, self->nonMmapBuffer, *numFrames );
        else
        {
            void *bufs[self->numHostChannels];
            unsigned int buf_per_ch_size = self->nonMmapBufferSize / self->numHostChannels;
            unsigned char *buffer = self->nonMmapBuffer;
            int i;
            for( i = 0; i < self->numHostChannels; ++i )
            {
                bufs[i] = buffer;
                buffer += buf_per_ch_size;
            }
            res = alsa_snd_pcm_readn( self->pcm, bufs, *numFrames );
        }
        if( res == -EPIPE || res == -ESTRPIPE )
        {
            *xrun = 1;
            *numFrames = 0;
        }
    }

end:
error:
    return result;
}